

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O3

int __thiscall anon_unknown.dwarf_285d7d::SndioCapture::recordProc(SndioCapture *this)

{
  uint uVar1;
  ALCdevice *pAVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ll_ringbuffer_data_pair data;
  undefined8 local_58;
  ulong uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  ulong uStack_40;
  
  SetRTPriority();
  althrd_setname("alsoft-record");
  pAVar2 = (this->super_BackendBase).mDevice;
  uVar3 = BytesFromDevFmt(pAVar2->FmtType);
  uVar4 = ChannelsFromDevFmt(pAVar2->FmtChans,pAVar2->mAmbiOrder);
  if (((this->mKillNow)._M_base._M_i & 1U) == 0) {
    uVar9 = (ulong)(uVar4 * uVar3);
    do {
      if (((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & 1U) == 0) {
        return 0;
      }
      RingBuffer::getWriteVector
                ((this->mRing)._M_t.
                 super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
                 super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
                 super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl);
      uVar5 = uStack_40 + uStack_50;
      if (uVar5 == 0) {
        uVar5 = 0x1000 / (ulong)(uVar4 * uVar3);
        uVar1 = ((this->super_BackendBase).mDevice)->UpdateSize;
        uVar8 = (ulong)uVar1;
        if ((uint)uVar5 < uVar1) {
          uVar8 = uVar5;
        }
        sio_read(this->mSndHandle,recordProc::junk,uVar8 * uVar9);
      }
      else {
        uStack_50 = uStack_50 * uVar9;
        uStack_40 = uStack_40 * uVar9;
        uVar8 = (ulong)((this->super_BackendBase).mDevice)->UpdateSize;
        if (uVar5 < uVar8) {
          uVar8 = uVar5;
        }
        uVar8 = uVar8 * uVar9;
        uVar5 = 0;
        if (uVar8 != 0) {
          do {
            if (uStack_50 == 0) {
              local_58 = CONCAT44(uStack_44,local_48);
              uStack_50 = uStack_40;
            }
            uVar7 = uVar8 - uVar5;
            if (uStack_50 <= uVar8 - uVar5) {
              uVar7 = uStack_50;
            }
            lVar6 = sio_read(this->mSndHandle,local_58,uVar7);
            if (lVar6 == 0) {
              ALCdevice::handleDisconnect
                        ((this->super_BackendBase).mDevice,"Failed to read capture samples");
              break;
            }
            local_58 = local_58 + lVar6;
            uStack_50 = uStack_50 - lVar6;
            uVar5 = uVar5 + lVar6;
          } while (uVar5 < uVar8);
        }
        RingBuffer::writeAdvance
                  ((this->mRing)._M_t.
                   super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
                   super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
                   super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl,uVar5 / uVar9);
      }
    } while (((this->mKillNow)._M_base._M_i & 1U) == 0);
  }
  return 0;
}

Assistant:

int SndioCapture::recordProc()
{
    SetRTPriority();
    althrd_setname(RECORD_THREAD_NAME);

    const ALuint frameSize{mDevice->frameSizeFromFmt()};

    while(!mKillNow.load(std::memory_order_acquire) &&
          mDevice->Connected.load(std::memory_order_acquire))
    {
        auto data = mRing->getWriteVector();
        size_t todo{data.first.len + data.second.len};
        if(todo == 0)
        {
            static char junk[4096];
            sio_read(mSndHandle, junk,
                minz(sizeof(junk)/frameSize, mDevice->UpdateSize)*frameSize);
            continue;
        }

        size_t total{0u};
        data.first.len  *= frameSize;
        data.second.len *= frameSize;
        todo = minz(todo, mDevice->UpdateSize) * frameSize;
        while(total < todo)
        {
            if(!data.first.len)
                data.first = data.second;

            size_t got{sio_read(mSndHandle, data.first.buf, minz(todo-total, data.first.len))};
            if(!got)
            {
                mDevice->handleDisconnect("Failed to read capture samples");
                break;
            }

            data.first.buf += got;
            data.first.len -= got;
            total += got;
        }
        mRing->writeAdvance(total / frameSize);
    }

    return 0;
}